

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O3

void __thiscall
chaiscript::dispatch::
Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>::
~Dynamic_Proxy_Function_Impl
          (Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
           *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pTVar2;
  
  (this->super_Dynamic_Proxy_Function).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Dynamic_Proxy_Function_003d0660;
  p_Var1 = (this->super_Dynamic_Proxy_Function).m_parsenode.
           super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->super_Dynamic_Proxy_Function).m_guard.
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
  ::~vector(&(this->super_Dynamic_Proxy_Function).m_param_types.m_types);
  (this->super_Dynamic_Proxy_Function).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_003ce9f8;
  pTVar2 = (this->super_Dynamic_Proxy_Function).super_Proxy_Function_Base.m_types.
           super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)(this->super_Dynamic_Proxy_Function).super_Proxy_Function_Base.
                                 m_types.
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar2);
  }
  operator_delete(this,0x70);
  return;
}

Assistant:

Dynamic_Proxy_Function_Impl(Callable t_f,
                                  int t_arity = -1,
                                  std::shared_ptr<AST_Node> t_parsenode = AST_NodePtr(),
                                  Param_Types t_param_types = Param_Types(),
                                  Proxy_Function t_guard = Proxy_Function())
          : Dynamic_Proxy_Function(t_arity, std::move(t_parsenode), std::move(t_param_types), std::move(t_guard))
          , m_f(std::move(t_f)) {
      }